

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O3

void BamTools::Options::AddValueOption<unsigned_int,unsigned_int_const>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,uint *val,OptionGroup *group,
               uint *defaultValue)

{
  size_t *psVar1;
  uint uVar2;
  ImplBase *pIVar3;
  mapped_type *pmVar4;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined2 local_80;
  Variant local_78;
  bool *local_70;
  uint *puStack_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined2 local_40;
  bool local_3e;
  Variant local_38;
  
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0._8_8_ = 0;
  local_e0[0x10] = '\0';
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80._0_1_ = true;
  local_80._1_1_ = false;
  local_78.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_e0);
  std::__cxx11::string::_M_assign((string *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&local_a0);
  uVar2 = *defaultValue;
  pIVar3 = (ImplBase *)operator_new(0x18);
  pIVar3->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f68;
  *(uint *)&pIVar3[1]._vptr_ImplBase = uVar2;
  pIVar3->refs = 2;
  if (local_78.data != (ImplBase *)0x0) {
    psVar1 = &(local_78.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_78.data)->_vptr_ImplBase[1])();
    }
  }
  pIVar3->refs = 1;
  local_80._1_1_ = true;
  local_78.data = pIVar3;
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_e0);
  local_58 = 0;
  local_50[0] = 0;
  local_40 = 0x100;
  local_3e = false;
  local_38.data = (ImplBase *)0x0;
  uVar2 = *val;
  local_70 = foundArgument;
  puStack_68 = val;
  local_60 = local_50;
  local_38.data = (ImplBase *)operator_new(0x18);
  (local_38.data)->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f0f68;
  *(uint *)&local_38.data[1]._vptr_ImplBase = uVar2;
  (local_38.data)->refs = 1;
  local_3e = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_60);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
           ::operator[](&m_optionsMap_abi_cxx11_,argument);
  pmVar4->pFoundArgument = local_70;
  pmVar4->pValue = puStack_68;
  std::__cxx11::string::_M_assign((string *)&pmVar4->ValueTypeDescription);
  pmVar4->IsRequired = local_3e;
  pmVar4->UseVector = (bool)(undefined1)local_40;
  pmVar4->StoreValue = (bool)local_40._1_1_;
  Variant::operator=(&pmVar4->VariantValue,&local_38);
  if (local_38.data != (ImplBase *)0x0) {
    psVar1 = &(local_38.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_38.data)->_vptr_ImplBase[1])();
    }
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_78.data != (ImplBase *)0x0) {
    psVar1 = &(local_78.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_78.data)->_vptr_ImplBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p);
  }
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_);
  }
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group, D& defaultValue)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    o.DefaultValue = defaultValue;
    o.HasDefaultValue = true;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}